

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O1

void Abc_InfoRandomBytes(uint *p,int nWords)

{
  uint uVar1;
  long lVar2;
  
  if (0 < nWords) {
    lVar2 = (ulong)(uint)nWords + 1;
    do {
      uVar1 = rand();
      p[lVar2 + -2] =
           (int)(uVar1 << 0x1c) >> 0x1f & 0xffU |
           (int)(uVar1 << 0x1d) >> 0x1f & 0xff00U |
           (int)(uVar1 << 0x1e) >> 0x1f & 0xff0000U | -(uVar1 & 1) & 0xff000000;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void Abc_InfoRandomBytes( unsigned * p, int nWords ) 
{ 
    int i, Num; 
    for ( i = nWords - 1; i >= 0; i-- ) 
    { 
        Num = rand(); 
        p[i] = (Num & 1)? 0xff : 0;
        p[i] = (p[i] << 8) | ((Num & 2)? 0xff : 0);
        p[i] = (p[i] << 8) | ((Num & 4)? 0xff : 0);
        p[i] = (p[i] << 8) | ((Num & 8)? 0xff : 0);
    } 
//    Extra_PrintBinary( stdout, p, 32 ); printf( "\n" );
}